

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O0

void __thiscall
t_haxe_generator::generate_haxe_doc(t_haxe_generator *this,ostream *out,t_function *tfunction)

{
  t_function *out_00;
  bool bVar1;
  string *psVar2;
  t_struct *this_00;
  reference pptVar3;
  ostream *poVar4;
  allocator local_271;
  string local_270;
  string local_250;
  allocator local_229;
  string local_228;
  allocator local_201;
  string local_200;
  t_field *local_1e0;
  t_field *p;
  t_field **local_1d0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1c8
  ;
  const_iterator p_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198;
  t_function *local_20;
  t_function *tfunction_local;
  ostream *out_local;
  t_haxe_generator *this_local;
  
  local_20 = tfunction;
  tfunction_local = (t_function *)out;
  out_local = (ostream *)this;
  bVar1 = t_doc::has_doc(&tfunction->super_t_doc);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    psVar2 = t_doc::get_doc_abi_cxx11_(&local_20->super_t_doc);
    std::operator<<(&local_198,(string *)psVar2);
    this_00 = t_function::get_arglist(local_20);
    p_iter._M_current = (t_field **)t_struct::get_members(this_00);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_1c8);
    local_1d0 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(p_iter._M_current);
    local_1c8._M_current = local_1d0;
    while( true ) {
      p = (t_field *)
          std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)p_iter._M_current);
      bVar1 = __gnu_cxx::operator!=
                        (&local_1c8,
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&p);
      out_00 = tfunction_local;
      if (!bVar1) break;
      pptVar3 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_1c8);
      local_1e0 = *pptVar3;
      poVar4 = std::operator<<(&local_198,"\n@param ");
      psVar2 = t_field::get_name_abi_cxx11_(local_1e0);
      std::operator<<(poVar4,(string *)psVar2);
      bVar1 = t_doc::has_doc(&local_1e0->super_t_doc);
      if (bVar1) {
        poVar4 = std::operator<<(&local_198," ");
        psVar2 = t_doc::get_doc_abi_cxx11_(&local_1e0->super_t_doc);
        std::operator<<(poVar4,(string *)psVar2);
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_1c8);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_200,"/**\n",&local_201);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_228," * ",&local_229);
    std::__cxx11::stringstream::str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_270," */\n",&local_271);
    t_generator::generate_docstring_comment
              ((t_generator *)this,(ostream *)out_00,&local_200,&local_228,&local_250,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  return;
}

Assistant:

void t_haxe_generator::generate_haxe_doc(ostream& out, t_function* tfunction) {
  if (tfunction->has_doc()) {
    stringstream ss;
    ss << tfunction->get_doc();
    const vector<t_field*>& fields = tfunction->get_arglist()->get_members();
    vector<t_field*>::const_iterator p_iter;
    for (p_iter = fields.begin(); p_iter != fields.end(); ++p_iter) {
      t_field* p = *p_iter;
      ss << "\n@param " << p->get_name();
      if (p->has_doc()) {
        ss << " " << p->get_doc();
      }
    }
    generate_docstring_comment(out, "/**\n", " * ", ss.str(), " */\n");
  }
}